

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O3

int build_cur_mv(int_mv *cur_mv,PREDICTION_MODE this_mode,AV1_COMMON *cm,MACROBLOCK *x,
                int skip_repeated_ref_mv)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  MB_MODE_INFO *pMVar4;
  bool bVar5;
  bool bVar6;
  undefined1 *puVar7;
  uint uVar8;
  MV MVar9;
  ulong uVar10;
  ulong uVar11;
  MV *pMVar12;
  int_mv *piVar13;
  int iVar14;
  short sVar15;
  int iVar16;
  undefined7 in_register_00000031;
  byte bVar17;
  ushort uVar18;
  short sVar19;
  int iVar20;
  uint32_t *puVar21;
  ushort uVar22;
  MV MVar23;
  int iVar24;
  int_mv *piVar25;
  uint32_t *puVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  ushort uVar30;
  uint uVar31;
  
  pMVar4 = *(x->e_mbd).mi;
  cVar1 = pMVar4->ref_frame[1];
  bVar6 = true;
  lVar29 = 0;
  do {
    uVar31 = *(ushort *)&pMVar4->field_0xa7 >> 4 & 3;
    puVar7 = compound_ref1_mode_lut;
    if (bVar6) {
      puVar7 = compound_ref0_mode_lut;
    }
    cVar2 = puVar7[CONCAT71(in_register_00000031,this_mode) & 0xffffffff];
    if (cVar2 == '\x10') {
LAB_0021d3f3:
      bVar17 = pMVar4->ref_frame[0];
      bVar3 = pMVar4->ref_frame[1];
      if ('\0' < (char)bVar3) {
        if (bVar3 < 5 || '\x04' < (char)bVar17) {
          lVar28 = 0;
          do {
            if ((bVar17 == (&comp_ref0_lut)[lVar28]) && (bVar3 == (&comp_ref1_lut)[lVar28])) {
              bVar17 = (char)lVar28 + 0x14;
              goto LAB_0021d43d;
            }
            lVar28 = lVar28 + 1;
          } while (lVar28 != 9);
        }
        bVar17 = (bVar3 * '\x04' + bVar17) - 0xd;
      }
LAB_0021d43d:
      piVar13 = &(x->mbmi_ext).ref_mv_stack[bVar17][uVar31].comp_mv;
      if (bVar6) {
        piVar13 = &(x->mbmi_ext).ref_mv_stack[bVar17][uVar31].this_mv;
      }
      cur_mv[lVar29] = *piVar13;
      uVar31 = 1;
    }
    else {
      if (cVar2 == '\x0f') {
        if (skip_repeated_ref_mv != 0) {
          bVar17 = pMVar4->ref_frame[0];
          bVar3 = pMVar4->ref_frame[1];
          if ('\0' < (char)bVar3) {
            if (bVar3 < 5 || '\x04' < (char)bVar17) {
              lVar28 = 0;
              do {
                if ((bVar17 == (&comp_ref0_lut)[lVar28]) && (bVar3 == (&comp_ref1_lut)[lVar28])) {
                  bVar17 = (char)lVar28 + 0x14;
                  goto LAB_0021d209;
                }
                lVar28 = lVar28 + 1;
              } while (lVar28 != 9);
            }
            bVar17 = (bVar3 * '\x04' + bVar17) - 0xd;
          }
LAB_0021d209:
          bVar3 = (x->mbmi_ext).ref_mv_count[bVar17];
          if (bVar3 != 1) {
            if (bVar3 == 0) {
              return (uint)bVar3;
            }
            uVar10 = (ulong)bVar3;
            if (3 < bVar3) {
              uVar10 = 4;
            }
            piVar13 = &(x->mbmi_ext).ref_mv_stack[bVar17][0].comp_mv;
            do {
              piVar25 = piVar13 + 0xffffffffffffffff;
              if (!bVar6) {
                piVar25 = piVar13;
              }
              if (piVar25->as_int == (x->mbmi_ext).global_mvs[pMVar4->ref_frame[lVar29]].as_int) {
                return 0;
              }
              piVar13 = piVar13 + 2;
              uVar10 = uVar10 - 1;
            } while (uVar10 != 0);
          }
        }
LAB_0021d3df:
        pMVar12 = (MV *)((x->mbmi_ext).global_mvs + pMVar4->ref_frame[lVar29]);
      }
      else {
        bVar17 = pMVar4->ref_frame[0];
        uVar11 = (ulong)bVar17;
        bVar3 = pMVar4->ref_frame[1];
        uVar10 = uVar11;
        if ('\0' < (char)bVar3) {
          if (bVar3 < 5 || '\x04' < (char)bVar17) {
            lVar28 = 0;
            do {
              if ((bVar17 == (&comp_ref0_lut)[lVar28]) && (bVar3 == (&comp_ref1_lut)[lVar28])) {
                uVar10 = (ulong)(byte)((char)lVar28 + 0x14);
                goto LAB_0021d2bc;
              }
              lVar28 = lVar28 + 1;
            } while (lVar28 != 9);
          }
          uVar10 = (ulong)(byte)((bVar3 * '\x04' + bVar17) - 0xd);
        }
LAB_0021d2bc:
        uVar8 = uVar31 + 1;
        if (cVar2 == '\r') {
          uVar8 = 0;
        }
        if ((x->mbmi_ext).ref_mv_count[uVar10] <= uVar8) {
          if (skip_repeated_ref_mv != 0) {
            if ('\0' < (char)bVar3) {
              if (bVar3 < 5 || '\x04' < (char)bVar17) {
                lVar28 = 0;
                do {
                  if ((bVar17 == (&comp_ref0_lut)[lVar28]) && (bVar3 == (&comp_ref1_lut)[lVar28])) {
                    uVar11 = (ulong)(byte)((char)lVar28 + 0x14);
                    goto LAB_0021d354;
                  }
                  lVar28 = lVar28 + 1;
                } while (lVar28 != 9);
              }
              uVar11 = (ulong)(byte)((bVar3 * '\x04' + bVar17) - 0xd);
            }
LAB_0021d354:
            bVar17 = (x->mbmi_ext).ref_mv_count[uVar11];
            if (cVar2 == '\x0f') {
              uVar8 = (uint)bVar17;
              if (uVar8 != 1) {
                if (uVar8 == 0) {
                  return (uint)bVar17;
                }
                uVar10 = (ulong)uVar8;
                if (3 < bVar17) {
                  uVar10 = 4;
                }
                puVar21 = (uint32_t *)
                          ((long)&(x->mbmi_ext).ref_mv_stack[0][0].comp_mv +
                          (ulong)(uint)((int)uVar11 << 5));
                do {
                  puVar26 = puVar21 + -1;
                  if (!bVar6) {
                    puVar26 = puVar21;
                  }
                  if (*puVar26 == (x->mbmi_ext).global_mvs[pMVar4->ref_frame[lVar29]].as_int) {
                    return 0;
                  }
                  puVar21 = puVar21 + 2;
                  uVar10 = uVar10 - 1;
                } while (uVar10 != 0);
              }
            }
            else if ((cVar2 == '\x0e') && (bVar17 < 2)) {
              return 0;
            }
          }
          goto LAB_0021d3df;
        }
        if (bVar6) {
          pMVar12 = (MV *)((long)&(x->mbmi_ext).ref_mv_stack[0][uVar8].this_mv +
                          (ulong)(uint)((int)uVar10 << 5));
        }
        else {
          pMVar12 = (MV *)((long)&(x->mbmi_ext).ref_mv_stack[0][uVar8].comp_mv +
                          (ulong)(uint)((int)uVar10 << 5));
        }
      }
      if (cVar2 == '\x10') goto LAB_0021d3f3;
      MVar23 = *pMVar12;
      cur_mv[lVar29].as_mv = MVar23;
      uVar31 = (uint)MVar23 >> 0x10;
      uVar30 = MVar23.col;
      sVar15 = MVar23.row;
      if ((cm->features).cur_frame_force_integer_mv == false) {
        if (((cm->features).allow_high_precision_mv == false) &&
           (MVar23 = (MV)(((uint)(sVar15 < 1) * 2 - 1 & -((uint)MVar23 & 1)) + (int)MVar23),
           (uVar31 & 1) != 0)) {
          uVar30 = (uVar30 + (ushort)((short)uVar30 < 1) * 2) - 1;
        }
      }
      else {
        MVar9 = (MV)((int)MVar23 + 7);
        if (-1 < sVar15) {
          MVar9 = MVar23;
        }
        uVar18 = sVar15 - (MVar9.row & 0xfff8U);
        MVar9 = MVar23;
        if (uVar18 != 0) {
          MVar9 = (MV)((int)MVar23 - (uint)uVar18);
          uVar22 = -uVar18;
          if (0 < (short)uVar18) {
            uVar22 = uVar18;
          }
          if (4 < uVar22) {
            MVar9 = (MV)(((int)MVar9 + (uint)(0 < (short)uVar18) * 0x10) - 8);
          }
        }
        uVar18 = uVar30 + 7;
        if (-1 < (int)MVar23) {
          uVar18 = uVar30;
        }
        uVar18 = uVar30 - (uVar18 & 0xfff8);
        MVar23 = MVar9;
        if (uVar18 != 0) {
          uVar30 = uVar30 - uVar18;
          uVar22 = -uVar18;
          if (0 < (short)uVar18) {
            uVar22 = uVar18;
          }
          if (4 < uVar22) {
            uVar30 = (uVar30 + (ushort)(0 < (short)uVar18) * 0x10) - 8;
          }
        }
      }
      iVar24 = (x->e_mbd).mb_to_left_edge + -0x8e0;
      iVar16 = (x->e_mbd).mb_to_right_edge + 0x8e0;
      iVar27 = (x->e_mbd).mb_to_top_edge + -0x8e0;
      iVar20 = (x->e_mbd).mb_to_bottom_edge + 0x8e0;
      iVar14 = (int)(short)uVar30;
      if (iVar14 < iVar16) {
        iVar16 = iVar14;
      }
      sVar15 = (short)iVar16;
      if (iVar14 < iVar24) {
        sVar15 = (short)iVar24;
      }
      *(short *)((long)cur_mv + lVar29 * 4 + 2) = sVar15;
      iVar16 = (int)MVar23.row;
      if (iVar16 < iVar20) {
        iVar20 = iVar16;
      }
      if (iVar16 < iVar27) {
        iVar20 = iVar27;
      }
      sVar19 = (short)iVar20;
      cur_mv[lVar29].as_mv.row = sVar19;
      iVar16 = (int)((uint)(-1 < sVar15) + (int)sVar15 + 3) >> 3;
      uVar31 = 0;
      if ((((x->mv_limits).col_min <= iVar16) && (iVar16 <= (x->mv_limits).col_max)) &&
         (iVar16 = (int)((int)sVar19 + (uint)(-1 < sVar19) + 3) >> 3, uVar31 = 0,
         (x->mv_limits).row_min <= iVar16)) {
        uVar31 = (uint)(iVar16 <= (x->mv_limits).row_max);
      }
    }
    lVar29 = 1;
    bVar5 = (bool)(bVar6 & '\0' < cVar1);
    bVar6 = false;
    if (!bVar5) {
      return uVar31;
    }
  } while( true );
}

Assistant:

static inline int build_cur_mv(int_mv *cur_mv, PREDICTION_MODE this_mode,
                               const AV1_COMMON *cm, const MACROBLOCK *x,
                               int skip_repeated_ref_mv) {
  const MACROBLOCKD *xd = &x->e_mbd;
  const MB_MODE_INFO *mbmi = xd->mi[0];
  const int is_comp_pred = has_second_ref(mbmi);

  int ret = 1;
  for (int i = 0; i < is_comp_pred + 1; ++i) {
    int_mv this_mv;
    this_mv.as_int = INVALID_MV;
    ret = get_this_mv(&this_mv, this_mode, i, mbmi->ref_mv_idx,
                      skip_repeated_ref_mv, mbmi->ref_frame, &x->mbmi_ext);
    if (!ret) return 0;
    const PREDICTION_MODE single_mode = get_single_mode(this_mode, i);
    if (single_mode == NEWMV) {
      const uint8_t ref_frame_type = av1_ref_frame_type(mbmi->ref_frame);
      cur_mv[i] =
          (i == 0) ? x->mbmi_ext.ref_mv_stack[ref_frame_type][mbmi->ref_mv_idx]
                         .this_mv
                   : x->mbmi_ext.ref_mv_stack[ref_frame_type][mbmi->ref_mv_idx]
                         .comp_mv;
    } else {
      ret &= clamp_and_check_mv(cur_mv + i, this_mv, cm, x);
    }
  }
  return ret;
}